

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O3

void __thiscall vera::HaveDefines::printDefines(HaveDefines *this)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_defines)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#define ",8);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,*(char **)(p_Var2 + 2),(long)p_Var2[2]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void HaveDefines::printDefines() {
    for (DefinesMap_cit it = m_defines.begin(); it != m_defines.end(); ++it)
        std::cout << "#define " << it->first << " " << it->second << std::endl;
}